

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O1

int __thiscall Random_keys::avancaGeracoes(Random_keys *this,Graph *g)

{
  pointer ppRVar1;
  RK_Individual *pRVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  Random_keys *this_00;
  long lVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  double local_68;
  
  uVar10 = (long)this->tamPop - 1;
  ppRVar1 = (this->popAtual).super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar10) {
LAB_00106c9f:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
  }
  pRVar2 = ppRVar1[(long)this->tamPop + -1];
  ordenaPopulacaoAtual(this,g);
  if (this->numGeracoes < 1) {
    iVar13 = 0;
  }
  else {
    iVar13 = 0;
    iVar14 = 0;
    local_68 = pRVar2->active_loss * 100000.0;
    do {
      ordenaPopulacaoAtual(this,g);
      uVar10 = (long)this->tamPop - 1;
      ppRVar1 = (this->popAtual).
                super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->popAtual).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar10)
      goto LAB_00106c9f;
      dVar20 = ppRVar1[(long)this->tamPop + -1]->active_loss * 100000.0;
      if (dVar20 < local_68) {
        iVar13 = iVar14;
      }
      std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=
                (&this->popAnterior,&this->popAtual);
      dVar19 = (double)this->tamPop;
      uVar9 = (uint)(dVar19 * 0.05);
      iVar18 = (int)(dVar19 * 0.1);
      if ((int)uVar9 < this->tamPop - iVar18) {
        uVar15 = (ulong)(int)uVar9;
        do {
          iVar5 = rand();
          iVar5 = iVar5 % this->tamPop;
          iVar6 = rand();
          iVar6 = iVar6 % this->tamPop;
          iVar7 = rand();
          iVar7 = iVar7 % this->tamPop;
          iVar8 = rand();
          iVar8 = iVar8 % this->tamPop;
          uVar16 = (ulong)iVar6;
          ppRVar1 = (this->popAnterior).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = (long)(this->popAnterior).
                         super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3;
          uVar10 = uVar16;
          if ((uVar12 <= uVar16) || (uVar10 = (ulong)iVar7, uVar12 <= uVar10)) goto LAB_00106c9f;
          if (ppRVar1[uVar16]->active_loss <= ppRVar1[uVar10]->active_loss &&
              ppRVar1[uVar10]->active_loss != ppRVar1[uVar16]->active_loss) {
            iVar7 = iVar6;
          }
          uVar16 = (ulong)iVar7;
          uVar10 = uVar16;
          if ((uVar12 <= uVar16) || (uVar10 = (ulong)iVar8, uVar12 <= uVar10)) goto LAB_00106c9f;
          if (ppRVar1[uVar16]->active_loss <= ppRVar1[uVar10]->active_loss &&
              ppRVar1[uVar10]->active_loss != ppRVar1[uVar16]->active_loss) {
            iVar8 = iVar7;
          }
          while (iVar8 == iVar5) {
            iVar7 = rand();
            iVar8 = iVar7 % this->tamPop;
          }
          uVar16 = (ulong)iVar5;
          this_00 = (Random_keys *)
                    (this->popAnterior).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = (long)(this->popAnterior).
                         super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3;
          uVar10 = uVar16;
          if (((uVar12 <= uVar16) || (uVar11 = (ulong)iVar8, uVar10 = uVar11, uVar12 <= uVar11)) ||
             (ppRVar1 = (this->popAtual).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_start, uVar10 = uVar15,
             (ulong)((long)(this->popAtual).
                           super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar15
             )) goto LAB_00106c9f;
          pRVar2 = ppRVar1[uVar15];
          iVar7 = pRVar2->number_of_edges;
          if (0 < (long)iVar7) {
            lVar3 = *(long *)(*(long *)(&this_00->numGeracoes + uVar16 * 2) + 8);
            lVar4 = *(long *)(*(long *)(&this_00->numGeracoes + uVar11 * 2) + 8);
            this_00 = (Random_keys *)pRVar2->weights;
            lVar17 = 0;
            do {
              *(double *)(&this_00->numGeracoes + lVar17 * 2) =
                   (*(double *)(lVar3 + lVar17 * 8) + *(double *)(lVar4 + lVar17 * 8)) * 0.5;
              lVar17 = lVar17 + 1;
            } while (iVar7 != lVar17);
          }
          mutacao(this_00,pRVar2);
          uVar15 = uVar15 + 1;
        } while ((long)uVar15 < (long)this->tamPop - (long)iVar18);
      }
      if (0 < (int)uVar9) {
        uVar10 = 0;
        do {
          ppRVar1 = (this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->popAtual).
                            super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <=
              uVar10) goto LAB_00106c9f;
          RK_Individual::generate_random_weights(ppRVar1[uVar10]);
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (local_68 <= dVar20) {
        dVar20 = local_68;
      }
      iVar14 = iVar14 + 1;
      local_68 = dVar20;
    } while (iVar14 < this->numGeracoes);
  }
  ordenaPopulacaoAtual(this,g);
  return iVar13;
}

Assistant:

int Random_keys::avancaGeracoes(Graph *g){

    int melhorGeracao = 0;
    RK_Individual *best = popAtual.at(this->tamPop - 1);
    this->ordenaPopulacaoAtual(g);
    double perda = 100*1000*best->getActiveLoss();
    for(int k=0; k<this->numGeracoes; k++){

        /** calcula a funcao criterio para cada individuo
        e ordena a populacao da maior perda(pior individuo)
        pra menor perda(melhor individuo), perdaAtiva**/
        this->ordenaPopulacaoAtual(g);

        RK_Individual *best = popAtual.at(this->tamPop - 1);
        if (100*1000*best->getActiveLoss() < perda){
            perda = 100*1000*best->getActiveLoss();
//            printf("\ngeracao (%d)  melhor individuo: %lf kw", k, 100*1000*best->getPerdaAtiva());//resultado ja em kw
            melhorGeracao = k;
        }

        popAnterior = popAtual;

        int num_piores = 0.05*this->tamPop;
        int num_melhores = 0.1*this->tamPop;

        for(int i=num_piores; i<this->tamPop-num_melhores; i++){

            /** cruzamento entre pai1 e pai2 entre os
            individuos aleatorios da populacao anterior
            modificar por uma escolha em roleta no futuro**/
            int pai1 = rand() % this->tamPop;
//            int pai2 = rand() % this->tamPop; //aleatorio

            /**torneio com 3**/
            int cand1, cand2, cand3;
            cand1 = rand() % this->tamPop;
            cand2 = rand() % this->tamPop;
            cand3 = rand() % this->tamPop;

            if(popAnterior.at(cand1)->getActiveLoss() < popAnterior.at(cand2)->getActiveLoss()){
                cand2=cand1;
            }
            if(popAnterior.at(cand2)->getActiveLoss() < popAnterior.at(cand3)->getActiveLoss()){
                cand3=cand2;
            }

            int pai2 = cand3;

            while(pai2==pai1)
                pai2 = rand() % this->tamPop;

//            popAnterior.at(pai1)->cruzamentoMedia(popAnterior.at(pai2), popAtual.at(i));
            this->cruzamento1(popAnterior.at(pai1), popAnterior.at(pai2), popAtual.at(i));
//            popAtual.at(i)->mutacao();
            this->mutacao(popAtual.at(i));
        }

        /**aleatorio ao inves de manter piores**/
        for(int i=0; i<num_piores; i++)
            popAtual.at(i)->generate_random_weights();
    }

    this->ordenaPopulacaoAtual(g);

    return melhorGeracao;
}